

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  int iVar1;
  wchar_t *__dest;
  ulong uVar2;
  long lVar3;
  undefined1 *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char_type buffer [26];
  undefined8 uStack_90;
  undefined1 auStack_88 [104];
  
  __dest = *it;
  uVar7 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar9 = (long)iVar1;
  puVar4 = auStack_88 + lVar9 * 4;
  if (uVar7 < 100) {
    if (uVar7 < 10) goto LAB_0014ba6e;
    uVar7 = (ulong)(uint)((int)uVar7 * 2);
    *(int *)(auStack_88 + lVar9 * 4 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar7 + 1]
    ;
LAB_0014ba84:
    puVar4 = puVar4 + -4;
  }
  else {
    iVar8 = 0;
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 / 100;
      uVar2 = (ulong)(uint)(((int)uVar6 + (int)uVar7 * -100) * 2);
      *(int *)(puVar4 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar2 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(undefined4 *)(puVar4 + -8) = *(undefined4 *)(this + 0xc);
        *(int *)(puVar4 + -0xc) = (int)(char)internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar3 = -0x10;
          goto LAB_0014ba20;
        }
        puVar4 = puVar4 + -0xc;
      }
      else {
        *(int *)(puVar4 + -8) = (int)(char)internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar3 = -0xc;
LAB_0014ba20:
          *(undefined4 *)(puVar4 + lVar3) = *(undefined4 *)(this + 0xc);
          puVar4 = puVar4 + lVar3;
        }
        else {
          puVar4 = puVar4 + -8;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar6);
    if (uVar6 < 1000) {
LAB_0014ba6e:
      uVar5 = (uint)uVar7 | 0x30;
      goto LAB_0014ba95;
    }
    uVar7 = (ulong)(uint)((int)uVar7 * 2);
    *(int *)(puVar4 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar7 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_0014ba84;
    *(undefined4 *)(puVar4 + -8) = *(undefined4 *)(this + 0xc);
    puVar4 = puVar4 + -8;
  }
  uVar5 = (uint)(char)internal::basic_data<void>::DIGITS[uVar7];
LAB_0014ba95:
  *(uint *)(puVar4 + -4) = uVar5;
  if (iVar1 != 0) {
    uStack_90 = 0x14bab1;
    memcpy(__dest,auStack_88,lVar9 * 4);
  }
  *it = __dest + lVar9;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }